

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O0

void ImVector_int_resizeT(ImVector_int *self,int new_size,int v)

{
  int local_18;
  int local_14;
  int v_local;
  int new_size_local;
  ImVector_int *self_local;
  
  local_18 = v;
  local_14 = new_size;
  _v_local = self;
  ImVector<int>::resize(self,new_size,&local_18);
  return;
}

Assistant:

CIMGUI_API void ImVector_int_resizeT(ImVector_int* self,int new_size,const int v)
{
    return self->resize(new_size,v);
}